

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.cxx
# Opt level: O3

bool cmSetDirectoryPropertiesCommand::RunCommand
               (cmMakefile *mf,const_iterator ait,const_iterator aitend,string *errors)

{
  string *prop;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  if (ait._M_current != aitend._M_current) {
    pbVar4 = ait._M_current + 1;
    do {
      if (pbVar4 == aitend._M_current) {
        pcVar3 = (char *)errors->_M_string_length;
        pcVar2 = "Wrong number of arguments";
LAB_00249d5c:
        std::__cxx11::string::_M_replace((ulong)errors,0,pcVar3,(ulong)pcVar2);
        return false;
      }
      prop = pbVar4 + -1;
      iVar1 = std::__cxx11::string::compare((char *)prop);
      if (iVar1 == 0) {
        pcVar3 = (char *)errors->_M_string_length;
        pcVar2 = "Variables and cache variables should be set using SET command";
        goto LAB_00249d5c;
      }
      iVar1 = std::__cxx11::string::compare((char *)prop);
      if (iVar1 == 0) {
        pcVar3 = (char *)errors->_M_string_length;
        pcVar2 = "Commands and macros cannot be set using SET_CMAKE_PROPERTIES";
        goto LAB_00249d5c;
      }
      cmMakefile::SetProperty(mf,prop,(pbVar4->_M_dataplus)._M_p);
      pbVar5 = pbVar4 + 1;
      pbVar4 = pbVar4 + 2;
    } while (pbVar5 != aitend._M_current);
  }
  return true;
}

Assistant:

bool cmSetDirectoryPropertiesCommand::RunCommand(
  cmMakefile* mf, std::vector<std::string>::const_iterator ait,
  std::vector<std::string>::const_iterator aitend, std::string& errors)
{
  for (; ait != aitend; ait += 2) {
    if (ait + 1 == aitend) {
      errors = "Wrong number of arguments";
      return false;
    }
    const std::string& prop = *ait;
    const std::string& value = *(ait + 1);
    if (prop == "VARIABLES") {
      errors = "Variables and cache variables should be set using SET command";
      return false;
    }
    if (prop == "MACROS") {
      errors = "Commands and macros cannot be set using SET_CMAKE_PROPERTIES";
      return false;
    }
    mf->SetProperty(prop, value.c_str());
  }

  return true;
}